

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

size_t SSL_quic_max_handshake_flight_len(SSL *ssl,ssl_encryption_level_t level)

{
  pointer pSVar1;
  ssl_encryption_level_t level_local;
  SSL *ssl_local;
  
  switch(level) {
  case ssl_encryption_initial:
    ssl_local = (SSL *)0x4000;
    break;
  case ssl_encryption_early_data:
    ssl_local = (SSL *)0x0;
    break;
  case ssl_encryption_handshake:
    if ((ssl->field_0xa4 & 1) == 0) {
      if (0x4000 < ssl->max_cert_list << 1) {
        return (ulong)(ssl->max_cert_list << 1);
      }
    }
    else {
      pSVar1 = std::unique_ptr<bssl::SSL_CONFIG,_bssl::internal::Deleter>::operator->(&ssl->config);
      if (((pSVar1->verify_mode & 1) != 0) && (0x4000 < ssl->max_cert_list)) {
        return (ulong)ssl->max_cert_list;
      }
    }
    ssl_local = (SSL *)0x4000;
    break;
  case ssl_encryption_application:
    ssl_local = (SSL *)0x4000;
    break;
  default:
    ssl_local = (SSL *)0x0;
  }
  return (size_t)ssl_local;
}

Assistant:

size_t SSL_quic_max_handshake_flight_len(const SSL *ssl,
                                         enum ssl_encryption_level_t level) {
  // Limits flights to 16K by default when there are no large
  // (certificate-carrying) messages.
  static const size_t kDefaultLimit = 16384;

  switch (level) {
    case ssl_encryption_initial:
      return kDefaultLimit;
    case ssl_encryption_early_data:
      // QUIC does not send EndOfEarlyData.
      return 0;
    case ssl_encryption_handshake:
      if (ssl->server) {
        // Servers may receive Certificate message if configured to request
        // client certificates.
        if (!!(ssl->config->verify_mode & SSL_VERIFY_PEER) &&
            ssl->max_cert_list > kDefaultLimit) {
          return ssl->max_cert_list;
        }
      } else {
        // Clients may receive both Certificate message and a CertificateRequest
        // message.
        if (2 * ssl->max_cert_list > kDefaultLimit) {
          return 2 * ssl->max_cert_list;
        }
      }
      return kDefaultLimit;
    case ssl_encryption_application:
      // Note there is not actually a bound on the number of NewSessionTickets
      // one may send in a row. This level may need more involved flow
      // control. See https://github.com/quicwg/base-drafts/issues/1834.
      return kDefaultLimit;
  }

  return 0;
}